

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine.cpp
# Opt level: O0

int __thiscall QFSFileEngine::open(QFSFileEngine *this,char *__file,int __oflag,...)

{
  long lVar1;
  long in_FS_OFFSET;
  QFSFileEnginePrivate *d;
  ProcessOpenModeResult res;
  undefined7 in_stack_ffffffffffffff90;
  undefined1 in_stack_ffffffffffffff97;
  FileError error;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined1 uVar2;
  
  error = (FileError)((ulong)this >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  d_func((QFSFileEngine *)0x19d037);
  processOpenModeFlags(res.openMode);
  QAbstractFileEngine::setError
            ((QAbstractFileEngine *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
             error,(QString *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90));
  uVar2 = 0;
  ProcessOpenModeResult::~ProcessOpenModeResult((ProcessOpenModeResult *)0x19d155);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (uint)CONCAT71((int7)((ulong)*(long *)(in_FS_OFFSET + 0x28) >> 8),uVar2) & 0xffffff01;
}

Assistant:

bool QFSFileEngine::open(QIODevice::OpenMode openMode, FILE *fh, QFile::FileHandleFlags handleFlags)
{
    Q_ASSERT_X(openMode & QIODevice::Unbuffered, "QFSFileEngine::open",
               "QFSFileEngine no longer supports buffered mode; upper layer must buffer");

    Q_D(QFSFileEngine);

    const ProcessOpenModeResult res = processOpenModeFlags(openMode);
    if (!res.ok) {
        setError(QFileDevice::OpenError, res.error);
        return false;
    }

    d->openMode = res.openMode;
    d->lastFlushFailed = false;
    d->closeFileHandle = handleFlags.testAnyFlag(QFile::AutoCloseHandle);
    d->fileEntry.clear();
    d->tried_stat = 0;
    d->fd = -1;

    return d->openFh(d->openMode, fh);
}